

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cc
# Opt level: O3

void conjugate_gradient_test(void)

{
  double *b;
  double *x;
  double *result;
  value_type *__val;
  int i;
  long lVar1;
  value_type *__val_1;
  vector<double,_std::allocator<double>_> local_f8;
  vector<double,_std::allocator<double>_> local_e0;
  SparseMatrix local_c8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_88;
  SparseMatrix local_68;
  
  puts("conjugate_gradient_test {");
  SparseMatrix::SparseMatrix(&local_c8,4,2);
  SparseMatrix::set_element(&local_c8,0,0,1.0);
  SparseMatrix::set_element(&local_c8,0,1,2.0);
  SparseMatrix::set_element(&local_c8,1,0,2.0);
  SparseMatrix::set_element(&local_c8,1,1,-3.0);
  SparseMatrix::set_element(&local_c8,2,0,4.0);
  SparseMatrix::set_element(&local_c8,2,1,-1.0);
  SparseMatrix::set_element(&local_c8,3,0,-5.0);
  SparseMatrix::set_element(&local_c8,3,1,2.0);
  b = (double *)operator_new(0x20);
  local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = b + 4;
  *b = 3.0;
  b[1] = 2.0;
  b[2] = -4.0;
  b[3] = 5.0;
  local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = b;
  local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  x = (double *)operator_new(0x10);
  *x = 0.0;
  x[1] = 0.0;
  Math::conjugate_gradient(&local_c8,b,2,x);
  result = (double *)operator_new(0x20);
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = result + 4;
  result[2] = 0.0;
  result[3] = 0.0;
  *result = 0.0;
  result[1] = 0.0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = result;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  SparseMatrix::multiply_column(&local_c8,x,result);
  printf("x: %lf %lf\n",SUB84(*x,0),SUB84(x[1],0));
  lVar1 = 0;
  do {
    printf(" %lf(%lf)",SUB84(result[lVar1],0),SUB84(b[lVar1],0));
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  putchar(10);
  SparseMatrix::SparseMatrix(&local_68,1,2);
  local_88.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_c8.data_.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_c8.data_.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_c8.data_.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_c8.data_.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.data_.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_c8.data_.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_68.data_.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_c8.data_.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_68.data_.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68.data_.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.data_.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.data_.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_88);
  local_88.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_c8.col_.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_c8.col_.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_88.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_c8.col_.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_c8.col_.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.col_.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_c8.col_.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_68.col_.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_c8.col_.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_68.col_.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68.col_.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.col_.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.col_.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_88);
  local_c8.num_rows_ = local_68.num_rows_;
  local_c8.num_cols_ = local_68.num_cols_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_68.col_);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_68.data_);
  SparseMatrix::set_element(&local_c8,0,0,1.0);
  SparseMatrix::set_element(&local_c8,0,1,2.0);
  std::vector<double,_std::allocator<double>_>::resize(&local_e0,1);
  *local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 3.0;
  *x = 7.0;
  x[1] = -3.0;
  Math::conjugate_gradient
            (&local_c8,
             local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,1,x);
  std::vector<double,_std::allocator<double>_>::resize(&local_f8,1);
  SparseMatrix::multiply_column
            (&local_c8,x,
             local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  printf("x: %lf %lf\n",SUB84(*x,0),SUB84(x[1],0));
  printf(" %lf(%lf)",
         SUB84(*local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,0),
         SUB84(*local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,0));
  putchar(10);
  puts("} conjugate_gradient_test");
  if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  operator_delete(x,0x10);
  if (local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_c8.col_);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_c8.data_);
  return;
}

Assistant:

void conjugate_gradient_test() {
  printf("conjugate_gradient_test {\n");

  // Test Case 1
  SparseMatrix a(4, 2);
  a.set_element(0, 0, 1.0);
  a.set_element(0, 1, 2.0);

  a.set_element(1, 0, 2.0);
  a.set_element(1, 1, -3.0);

  a.set_element(2, 0, 4.0);
  a.set_element(2, 1, -1.0);

  a.set_element(3, 0, -5.0);
  a.set_element(3, 1, 2.0);

  // Suppose solution is (2, 3).
  std::vector<double> b(4);
  b[0] = 3.0;  // 8.0
  b[1] = 2.0;  // -5.0
  b[2] = -4.0;
  b[3] = 5.0;

  std::vector<double> x(2);
  x[0] = x[1] = 0.0;

  Math::conjugate_gradient(a, &b[0], 2, &x[0]);

  std::vector<double> c(4);
  a.multiply_column(&x[0], &c[0]);

  printf("x: %lf %lf\n", x[0], x[1]);

  for (int i = 0; i < 4; i++) {
    printf(" %lf(%lf)", c[i], b[i]);
  }
  printf("\n");

  // Test Case 2
  a = SparseMatrix(1, 2);
  a.set_element(0, 0, 1.0);
  a.set_element(0, 1, 2.0);

  b.resize(1);
  b[0] = 3.0;

  // x[0] = x[1] = 0.0;
  x[0] = 7.0;
  x[1] = -3.0;

  Math::conjugate_gradient(a, &b[0], 1, &x[0]);

  c.resize(1);
  a.multiply_column(&x[0], &c[0]);

  printf("x: %lf %lf\n", x[0], x[1]);

  for (int i = 0; i < 1; i++) {
    printf(" %lf(%lf)", c[i], b[i]);
  }
  printf("\n");

  printf("} conjugate_gradient_test\n");
}